

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O1

void cf_cbc_encrypt(cf_cbc *ctx,uint8_t *input,uint8_t *output,size_t blocks)

{
  uint8_t *__src;
  size_t __n;
  size_t sVar1;
  uint8_t buf [16];
  byte local_48 [24];
  
  if (blocks != 0) {
    __n = ctx->prp->blocksz;
    __src = ctx->block;
    do {
      if (__n != 0) {
        sVar1 = 0;
        do {
          local_48[sVar1] = __src[sVar1] ^ input[sVar1];
          sVar1 = sVar1 + 1;
        } while (__n != sVar1);
      }
      blocks = blocks - 1;
      (*ctx->prp->encrypt)(ctx->prpctx,local_48,__src);
      memcpy(output,__src,__n);
      input = input + __n;
      output = output + __n;
    } while (blocks != 0);
  }
  return;
}

Assistant:

void cf_cbc_encrypt(cf_cbc *ctx, const uint8_t *input, uint8_t *output, size_t blocks)
{
  uint8_t buf[CF_MAXBLOCK];
  size_t nblk = ctx->prp->blocksz;

  while (blocks--)
  {
    xor_bb(buf, input, ctx->block, nblk);
    ctx->prp->encrypt(ctx->prpctx, buf, ctx->block);
    memcpy(output, ctx->block, nblk);
    input += nblk;
    output += nblk;
  }
}